

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O3

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>::GradX<double>
          (TPZGeoBlend<pzgeom::TPZGeoPoint> *this,TPZFMatrix<double> *coord,
          TPZVec<double> *xiInterior,TPZFMatrix<double> *gradx)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  TPZFNMatrix<9,_double> gradNeigh;
  TPZFNMatrix<45,_double> gradXLin;
  TPZFNMatrix<27,_double> linearSideMappings;
  TPZFNMatrix<9,_double> dPhiDxi;
  TPZFNMatrix<9,_double> phi;
  TPZFNMatrix<27,_double> nonLinearSideMappings;
  TPZFMatrix<double> local_900;
  double local_870 [28];
  TPZVec<double> local_790;
  double local_770 [20];
  TPZFMatrix<double> local_6d0;
  double local_640 [46];
  TPZFMatrix<double> local_4d0;
  double local_440 [28];
  TPZFMatrix<double> local_360;
  double adStack_2d0 [10];
  TPZFMatrix<double> local_280;
  double local_1f0 [10];
  TPZFMatrix<double> local_1a0;
  double local_110 [28];
  
  (*(gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (gradx,3,0);
  if ((this->super_TPZGeoPoint).super_TPZNodeRep<1,_pztopology::TPZPoint>.fNodeIndexes[0] != -1) {
    TPZManVector<double,_3>::TPZManVector((TPZManVector<double,_3> *)&local_4d0,0);
    local_6d0.fElem = local_640;
    local_6d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
    local_6d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
    local_6d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_6d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_6d0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_01816238;
    local_6d0.fSize = 9;
    local_6d0.fGiven = local_6d0.fElem;
    TPZVec<int>::TPZVec(&local_6d0.fPivot.super_TPZVec<int>,0);
    local_6d0.fPivot.super_TPZVec<int>.fStore = local_6d0.fPivot.fExtAlloc;
    local_6d0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_6d0.fPivot.super_TPZVec<int>.fNElements = 0;
    local_6d0.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_6d0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_6d0.fWork.fStore = (double *)0x0;
    local_6d0.fWork.fNElements = 0;
    local_6d0.fWork.fNAlloc = 0;
    local_6d0.fElem = (double *)0x0;
    local_6d0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_01815f48;
    bVar4 = MapToNeighSide<double>(this,0,0,xiInterior,(TPZVec<double> *)&local_4d0,&local_6d0);
    if (!bVar4) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.cpp"
                 ,0x80);
    }
    local_900.fElem = local_870;
    local_900.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
    local_900.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
    local_900.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_900.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_900.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_01816238;
    local_900.fSize = 9;
    local_900.fGiven = local_900.fElem;
    TPZVec<int>::TPZVec(&local_900.fPivot.super_TPZVec<int>,0);
    local_900.fPivot.super_TPZVec<int>.fStore = local_900.fPivot.fExtAlloc;
    local_900.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_900.fPivot.super_TPZVec<int>.fNElements = 0;
    local_900.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_900.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_900.fWork.fStore = (double *)0x0;
    local_900.fWork.fNElements = 0;
    local_900.fWork.fNAlloc = 0;
    local_900.fElem = (double *)0x0;
    local_900.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_01815f48;
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.h"
               ,0x5f);
  }
  local_280.fElem = local_1f0;
  local_280.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
  local_280.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_280.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_280.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_280.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01816238;
  local_280.fSize = 9;
  local_280.fGiven = local_280.fElem;
  TPZVec<int>::TPZVec(&local_280.fPivot.super_TPZVec<int>,0);
  local_280.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_280.fPivot.super_TPZVec<int>.fStore = local_280.fPivot.fExtAlloc;
  local_280.fPivot.super_TPZVec<int>.fNElements = 0;
  local_280.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_280.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_280.fWork.fStore = (double *)0x0;
  local_280.fWork.fNElements = 0;
  local_280.fWork.fNAlloc = 0;
  local_280.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01815f48;
  local_360.fElem = adStack_2d0;
  local_360.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_360.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_360.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_360.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_360.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01816238;
  local_360.fSize = 9;
  local_360.fGiven = local_360.fElem;
  TPZVec<int>::TPZVec(&local_360.fPivot.super_TPZVec<int>,0);
  local_360.fPivot.super_TPZVec<int>.fStore = local_360.fPivot.fExtAlloc;
  local_360.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_360.fPivot.super_TPZVec<int>.fNElements = 0;
  local_360.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_360.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_360.fWork.fStore = (double *)0x0;
  local_360.fWork.fNElements = 0;
  local_360.fWork.fNAlloc = 0;
  local_360.fElem = (double *)0x0;
  local_360.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01815f48;
  pztopology::TPZPoint::TShape<double>(xiInterior,&local_280,&local_360);
  local_6d0.fElem = local_640;
  local_6d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_6d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_6d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_6d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_6d0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0189b8e8;
  local_6d0.fSize = 0x2d;
  local_6d0.fGiven = local_6d0.fElem;
  TPZVec<int>::TPZVec(&local_6d0.fPivot.super_TPZVec<int>,0);
  local_6d0.fPivot.super_TPZVec<int>.fStore = local_6d0.fPivot.fExtAlloc;
  local_6d0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_6d0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_6d0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_6d0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_6d0.fWork.fStore = (double *)0x0;
  local_6d0.fWork.fNElements = 0;
  local_6d0.fWork.fNAlloc = 0;
  local_6d0.fElem = (double *)0x0;
  local_6d0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0189b5f8;
  TPZFMatrix<double>::operator=(&local_6d0,0.0);
  lVar2 = (gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if (0 < lVar2) {
    lVar3 = (gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    lVar6 = 0;
    do {
      if (0 < lVar3) {
        lVar5 = 0;
        do {
          if ((local_6d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) ||
             (local_6d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar5)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((lVar2 <= lVar6) || (lVar3 <= lVar5)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          gradx->fElem[lVar2 * lVar5 + lVar6] =
               local_6d0.fElem
               [local_6d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar5 + lVar6];
          lVar5 = lVar5 + 1;
        } while (lVar5 < lVar3);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < lVar2);
  }
  local_900.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_900.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_900.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_900.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_900.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0189a510;
  local_900.fSize = 0x1b;
  local_900.fElem = local_870;
  local_900.fGiven = local_870;
  TPZVec<int>::TPZVec(&local_900.fPivot.super_TPZVec<int>,0);
  piVar1 = local_900.fPivot.fExtAlloc;
  local_900.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_900.fPivot.super_TPZVec<int>.fNElements = 0;
  local_900.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_900.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_900.fWork.fStore = (double *)0x0;
  local_900.fWork.fNElements = 0;
  local_900.fWork.fNAlloc = 0;
  local_900.fElem = (double *)0x0;
  local_900.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0189a220;
  local_900.fPivot.super_TPZVec<int>.fStore = piVar1;
  TPZFMatrix<double>::operator=(&local_900,0.0);
  TPZFMatrix<double>::~TPZFMatrix(&local_900,&PTR_PTR_0189a4d8);
  local_900.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_900.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_900.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_900.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_900.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0189a510;
  local_900.fSize = 0x1b;
  local_900.fElem = local_870;
  local_900.fGiven = local_870;
  TPZVec<int>::TPZVec(&local_900.fPivot.super_TPZVec<int>,0);
  local_900.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_900.fPivot.super_TPZVec<int>.fNElements = 0;
  local_900.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_900.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_900.fWork.fStore = (double *)0x0;
  local_900.fWork.fNElements = 0;
  local_900.fWork.fNAlloc = 0;
  local_900.fElem = (double *)0x0;
  local_900.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0189a220;
  local_900.fPivot.super_TPZVec<int>.fStore = piVar1;
  TPZFMatrix<double>::operator=(&local_900,0.0);
  TPZFMatrix<double>::~TPZFMatrix(&local_900,&PTR_PTR_0189a4d8);
  TPZVec<double>::TPZVec(&local_790,0);
  local_790._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0189a1c0;
  local_790.fNElements = 0;
  local_790.fNAlloc = 0;
  local_900.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_900.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_900.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_900.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_900.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0189a510;
  local_900.fSize = 0x1b;
  local_900.fElem = local_870;
  local_900.fGiven = local_870;
  local_790.fStore = local_770;
  TPZVec<int>::TPZVec(&local_900.fPivot.super_TPZVec<int>,0);
  local_900.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_900.fPivot.super_TPZVec<int>.fNElements = 0;
  local_900.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_900.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_900.fWork.fStore = (double *)0x0;
  local_900.fWork.fNElements = 0;
  local_900.fWork.fNAlloc = 0;
  local_900.fElem = (double *)0x0;
  local_900.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0189a220;
  local_900.fPivot.super_TPZVec<int>.fStore = piVar1;
  TPZFMatrix<double>::operator=(&local_900,0.0);
  local_4d0.fElem = local_440;
  local_4d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_4d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  local_4d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_4d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_4d0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0189a510;
  local_4d0.fSize = 0x1b;
  local_4d0.fGiven = local_4d0.fElem;
  TPZVec<int>::TPZVec(&local_4d0.fPivot.super_TPZVec<int>,0);
  local_4d0.fPivot.super_TPZVec<int>.fStore = local_4d0.fPivot.fExtAlloc;
  local_4d0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_4d0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_4d0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_4d0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_4d0.fWork.fStore = (double *)0x0;
  local_4d0.fWork.fNElements = 0;
  local_4d0.fWork.fNAlloc = 0;
  local_4d0.fElem = (double *)0x0;
  local_4d0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0189a220;
  TPZFMatrix<double>::operator=(&local_4d0,0.0);
  local_1a0.fElem = local_110;
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0189a510;
  local_1a0.fSize = 0x1b;
  local_1a0.fGiven = local_1a0.fElem;
  TPZVec<int>::TPZVec(&local_1a0.fPivot.super_TPZVec<int>,0);
  local_1a0.fPivot.super_TPZVec<int>.fStore = local_1a0.fPivot.fExtAlloc;
  local_1a0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_1a0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_1a0.fWork.fStore = (double *)0x0;
  local_1a0.fWork.fNElements = 0;
  local_1a0.fWork.fNAlloc = 0;
  local_1a0.fElem = (double *)0x0;
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0189a220;
  TPZFMatrix<double>::operator=(&local_1a0,0.0);
  TPZFMatrix<double>::~TPZFMatrix(&local_1a0,&PTR_PTR_0189a4d8);
  TPZFMatrix<double>::~TPZFMatrix(&local_4d0,&PTR_PTR_0189a4d8);
  TPZFMatrix<double>::~TPZFMatrix(&local_900,&PTR_PTR_0189a4d8);
  if (local_790.fStore != local_770) {
    local_790.fNAlloc = 0;
    local_790._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    if (local_790.fStore != (double *)0x0) {
      operator_delete__(local_790.fStore);
    }
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_6d0,&PTR_PTR_0189b8b0);
  TPZFMatrix<double>::~TPZFMatrix(&local_360,&PTR_PTR_01816200);
  TPZFMatrix<double>::~TPZFMatrix(&local_280,&PTR_PTR_01816200);
  return;
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::GradX(TPZFMatrix<REAL> &coord, TPZVec<T> &xiInterior, TPZFMatrix<T> &gradx) const {

    TPZGeoEl &gel = *fGeoEl;
    TPZGeoMesh *gmesh = gel.Mesh();
#ifdef PZ_LOG
    const auto VAL_WIDTH = 10;
    std::ostringstream soutLogDebug;
    if(logger.isDebugEnabled())
    {   soutLogDebug<<"======================_______REF_1"<<std::endl;
        soutLogDebug << "TPZGeoBlend<" <<MElementType_Name(TGeo::Type())<<">::GradX"<<std::endl;
        soutLogDebug << "element id " <<gel.Id()<<std::endl;
        soutLogDebug << "xi: ";
        for(int i = 0; i < xiInterior.size(); i++) soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<xiInterior[i]<<"\t";
        soutLogDebug<<std::endl;
    }
#endif
    const REAL zero = 1e-14;
    gradx.Redim(3,TGeo::Dimension);

    if (fNeighbours[TGeo::NSides - 1 -TGeo::NNodes].ElementIndex() != -1){
        TPZManVector<T, 3> neighXi;
        TPZFNMatrix<9, T> dNeighXiDXi;
        if (!MapToNeighSide(TGeo::NSides-1, TGeo::Dimension, xiInterior, neighXi, dNeighXiDXi)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << xi << " and side " << TGeo::NSides-1 << ". Aborting...";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            DebugStop();
        }
        TPZFNMatrix<9, T> gradNeigh;
        Neighbour(TGeo::NSides-1, gmesh).GradX(neighXi, gradNeigh);
        gradNeigh.Multiply(dNeighXiDXi,gradx);//gradNonLinSide = gradNeigh.dNeighXiDXi
        return;
    }

    /**
     * The non-linear mapping is calculated from deviations of the linear mapping.
     * The linear mapping of an element (or of any of its side) can be calculated with the barycentric coordinates
     * of the nodes contained in it
     */
    TPZFNMatrix<9, T> phi(TGeo::NNodes, 1), dPhiDxi(TGeo::Dimension, TGeo::NNodes);
    TGeo::TShape(xiInterior, phi, dPhiDxi);//gets the barycentric coordinates


    TPZFNMatrix<45,T> gradXLin(3, TGeo::Dimension,(T)0);
    for (int iNode = 0; iNode < TGeo::NNodes; iNode++) {//calculates the linear mapping
        for(int x = 0; x < 3; x++) {
            for (int xi = 0; xi < TGeo::Dimension; xi++) {
                gradXLin(x, xi) += coord(x, iNode) * dPhiDxi(xi, iNode);
            }
        }
    }
    for(int i = 0; i < gradx.Rows(); i++){
        for(int j = 0; j < gradx.Cols(); j++){
            gradx(i,j) = gradXLin(i,j);
        }
    }

#ifdef PZ_LOG
    soutLogDebug<<"FIRST TERM"<<std::endl;
    soutLogDebug << "gradient of linear mapping:\n";
    if (logger.isDebugEnabled()) {
        for (int i = 0; i < gradXLin.Rows(); i++) {
            for (int j = 0; j < gradXLin.Cols(); j++) {
                soutLogDebug << std::setw(VAL_WIDTH) << std::right << gradXLin(i, j);
                if (j != gradXLin.Cols() - 1) soutLogDebug << "\t";
            }
            soutLogDebug << std::endl;
        }
    }

#endif
    /**
     * Now, the deviation for any non-linearity of the sides' mappings must be taken into account.
     */

    TPZVec<TPZFMatrix<T> > gradNonLinSideVec(TGeo::NSides - TGeo::NNodes,
                                             TPZFNMatrix<27,T>(3, TGeo::Dimension, 0));
    TPZVec<TPZFMatrix<T> > gradLinSideVec(TGeo::NSides - TGeo::NNodes,
                                          TPZFNMatrix<27,T>(3, TGeo::Dimension, 0));
    TPZManVector<T, 20> blendFactor(TGeo::NSides - TGeo::NNodes, (T)0);
    TPZFNMatrix<27,T> dCorrFactorDxi(TGeo::NSides - TGeo::NNodes, TGeo::Dimension, (T) 0);
    TPZFNMatrix<27, T> linearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    TPZFNMatrix<27, T> nonLinearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    for (int sideIndex = 0; sideIndex < TGeo::NSides - TGeo::NNodes - 1; sideIndex++) {
        TPZManVector<T, 3> xiProjectedOverSide(TGeo::Dimension, 0);
        TPZFMatrix<T> &gradNonLinSide = gradNonLinSideVec[sideIndex];
        TPZFMatrix<T> &gradLinSide = gradLinSideVec[sideIndex];
        gradLinSide.Redim(3,TGeo::Dimension);
        gradNonLinSide.Redim(3,TGeo::Dimension);

        int side = TGeo::NNodes + sideIndex;
        TPZGeoElSide gelside(fNeighbours[sideIndex], gmesh);
        #ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "================================" << std::endl;
            soutLogDebug << "side: " << side << " is linear: ";
        }
        #endif
        if (IsLinearMapping(side) || !gelside.Exists()) {
            blendFactor[sideIndex] = 0;
            #ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                if (IsLinearMapping(side)) soutLogDebug << "true" << std::endl;
                else soutLogDebug << "false (no gelside) " << std::endl;
            }
            #endif
            continue;
        }
        #ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "false (gelside exists) " << std::endl;
        }
        #endif
        /**
     * Calculates the linear mapping of the side sideIndex, and the projected point on sideIndex
     */
        TPZManVector<T, 3> sideXi;
        TPZFNMatrix<9, T> transfXiToSideXi;
        bool regularMap = TGeo::CheckProjectionForSingularity(side, xiInterior);
        if (!regularMap) {
            #ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "mapping is not regular. skipping side... ";

            }
            #endif
            continue;
        }

        this->MapToSide(side, xiInterior, sideXi, transfXiToSideXi);
        MElementType sideType = TGeo::Type(side);
        const int nSideNodes = MElementType_NNodes(sideType);
        const int sideDim = TGeo::SideDimension(side);
        TPZFNMatrix<9, T> sidePhiVec(nSideNodes, 1),
                dSidePhiDSideXiVec(sideDim, nSideNodes);
        GetSideShapeFunction<TGeo>(side, sideXi, sidePhiVec, dSidePhiDSideXiVec);

        TPZFNMatrix<9, T> dXprojDxiSide(TGeo::Dimension,sideDim,(T)0),
                dXiProjectedOverSideDxi(TGeo::Dimension,TGeo::Dimension,(T)0);
        TPZManVector<REAL, 3> nodeCoord;
        //calculation of transformation for the derivatives of sidephi
        
        TPZFNMatrix<9, T> gradLinSideXiSide(3,sideDim,(T)0);
        for (int iNode = 0; iNode < nSideNodes; iNode++) {
            const int currentNode = TGeo::SideNodeLocId(side, iNode);

            for (int x = 0; x < 3; x++) {
                linearSideMappings(sideIndex, x) +=
                        coord(x, currentNode) * sidePhiVec(iNode, 0);
            }

            TGeo::ParametricDomainNodeCoord(currentNode, nodeCoord);
            for (int x = 0; x < TGeo::Dimension; x++) {
                xiProjectedOverSide[x] += nodeCoord[x] * sidePhiVec(iNode, 0);
            }

            for(int x = 0; x < 3; x++){
                for(int xi = 0; xi < sideDim; xi++) {
                    gradLinSideXiSide(x,xi) += coord(x, currentNode) * dSidePhiDSideXiVec(xi,iNode);
                }
            }

            for (int i = 0; i < TGeo::Dimension; i++) {
                for (int j = 0; j < sideDim; j++) {
                    dXprojDxiSide(i,j) += nodeCoord[i] * dSidePhiDSideXiVec(j,iNode);
                }
            }

        }

        gradLinSideXiSide.Multiply(transfXiToSideXi,gradLinSide);//gradLinSideTemp = gradLinSideXiSide.transfXiToSideXi
        dXprojDxiSide.Multiply(transfXiToSideXi,dXiProjectedOverSideDxi);//dXprojDxiTemp = dXprojDxiSide.transfXiToSideXi

        #ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "xi projection over side: ";
            for (int x = 0; x < TGeo::Dimension; x++) soutLogDebug << xiProjectedOverSide[x] << "\t";
            soutLogDebug << "\nGrad of projected point to side:\n";
            for(int i = 0; i < dXiProjectedOverSideDxi.Rows(); i++){
                for(int j = 0; j < dXiProjectedOverSideDxi.Cols(); j++){
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<dXiProjectedOverSideDxi(i,j);
                    if(j != dXiProjectedOverSideDxi.Cols() - 1) soutLogDebug<<"\t";
                }
                soutLogDebug<<std::endl;
            }
            soutLogDebug << std::endl << "xi projection in side domain:";
            for (int x = 0; x < sideXi.size(); x++) soutLogDebug << sideXi[x] << "\t";
            soutLogDebug << "\nTransformation from x side to xi interior:\n";
            for(int i = 0; i < transfXiToSideXi.Rows(); i++){
                for(int j = 0; j < transfXiToSideXi.Cols(); j++){
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<transfXiToSideXi(i,j);
                    if(j != transfXiToSideXi.Cols() - 1) soutLogDebug<<"\t";
                }
                soutLogDebug<<std::endl;
            }
            soutLogDebug << std::endl << "\nLinear mapping of projected point: ";
            for (int x = 0; x < 3; x++) soutLogDebug << linearSideMappings(sideIndex, x) << "\t";
            soutLogDebug << "\nGrad of linear mapping of point projected to side:\n";
            for(int i = 0; i < gradLinSide.Rows(); i++){
                for(int j = 0; j < gradLinSide.Cols(); j++){
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<gradLinSide(i,j);
                    if(j != gradLinSide.Cols() - 1) soutLogDebug<<"\t";
                }
                soutLogDebug<<std::endl;
            }
        }
        #endif
        /**
         * Calculates the non-linear mapping of the side sideIndex
         */
        {
            TPZManVector<T,3> dCorrFactor(TGeo::Dimension,(T)0);
            TGeo::BlendFactorForSide(side, xiInterior, blendFactor[sideIndex], dCorrFactor);
            for(int iXi = 0; iXi < TGeo::Dimension; iXi++){
                dCorrFactorDxi(sideIndex,iXi) = dCorrFactor[iXi];
            }
        }

        int sidedim = gelside.Dimension();
        TPZManVector<T, 3> neighXi;
        TPZFNMatrix<9, T> dNeighXiDXi;
        if (!MapToNeighSide(side, sidedim, xiInterior, neighXi, dNeighXiDXi)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << par << " and side " << byside << " skipping the side ";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            continue;
        }
        TPZManVector<T, 3> Xside(3, 0.);
        Neighbour(side, gmesh).X(neighXi, Xside);
        TPZFNMatrix<9, T> gradNeigh;
        Neighbour(side, gmesh).GradX(neighXi,gradNeigh);
        for (int x = 0; x < 3; x++) {
            nonLinearSideMappings(sideIndex, x) = Xside[x];
        }
        gradNeigh.Multiply(dNeighXiDXi,gradNonLinSide);//gradNonLinSide = gradNeigh.dNeighXiDXi

//        else{
        TPZStack<int> containedNodesInSide;
        TGeo::LowerDimensionSides(side, containedNodesInSide, 0);

        TPZStack<int> allContainedSides;
        TGeo::LowerDimensionSides(side, allContainedSides);
        for (int subSideIndex = containedNodesInSide.NElements();
             subSideIndex < allContainedSides.NElements(); subSideIndex++) {
//            TPZFNMatrix<9, T> gradNonLinSubSide(3,TGeo::Dimension,(T)0);
            const int subSide = allContainedSides[subSideIndex];
#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside " << subSideIndex << " (global: " << subSide << ") is linear: ";
                if (IsLinearMapping(subSide)) soutLogDebug << "true" << std::endl;
                else soutLogDebug << "false" << std::endl;
            }
#endif
            if (IsLinearMapping(subSide)) continue;

            T blendFactorSide = -1;
            TPZManVector<T,3> dCorrFactorSideDxiProj(TGeo::Dimension,(T)0);
            TPZFNMatrix<3, T> dCorrFactorSideDxi(TGeo::Dimension,1,(T)0);
            TGeo::BlendFactorForSide(subSide, xiProjectedOverSide, blendFactorSide, dCorrFactorSideDxiProj);

#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside influence :" << blendFactorSide << std::endl;
            }
#endif
            TPZFNMatrix<3, T> dCorrFactorSideDxiProjMat(1,TGeo::Dimension,(T)0);
            for(int xi = 0; xi < TGeo::Dimension; xi++){
                dCorrFactorSideDxiProjMat(0,xi) = dCorrFactorSideDxiProj[xi];
            }

//                 dCorrFactorSideDxi = dXiProjectedOverSideDxi. dCorrFactorSideDxiProjMat
//                dXiProjectedOverSideDxi.Multiply(dCorrFactorSideDxiProjMat,dCorrFactorSideDxi);//mostrarphil

//                dCorrFactorSideDxi = dCorrFactorSideDxiProjMat . dXiProjectedOverSideDxi;
            dCorrFactorSideDxiProjMat.Multiply(dXiProjectedOverSideDxi,dCorrFactorSideDxi);
            #ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\n\tGrad of correction factor of point projected to side:\n";
                for(int i = 0; i < dCorrFactorSideDxi.Rows(); i++){
                    soutLogDebug<<"\t";
                    for(int j = 0; j < dCorrFactorSideDxi.Cols(); j++){
                        soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<dCorrFactorSideDxi(i,j);
                        if(j != dCorrFactorSideDxi.Cols() - 1) soutLogDebug<<"\t";
                    }
                    soutLogDebug<<std::endl;
                }
            }
            #endif
            TPZFMatrix<T> &gradNonLinSubSide = gradNonLinSideVec[subSide - TGeo::NNodes];
            TPZFMatrix<T> &gradLinSubSide = gradLinSideVec[subSide - TGeo::NNodes];
            for (int x = 0; x < 3; x++) {
                nonLinearSideMappings(sideIndex, x) -=
                        blendFactorSide *
                        (nonLinearSideMappings(subSide - TGeo::NNodes, x) -
                         linearSideMappings(subSide - TGeo::NNodes, x));
                for (int j = 0; j < TGeo::Dimension; j++) {
                    gradNonLinSide(x,j) -= blendFactorSide *  (gradNonLinSubSide(x,j)-gradLinSubSide(x,j));
                    gradNonLinSide(x,j) -= dCorrFactorSideDxi(0,j) *
                                           (nonLinearSideMappings(subSide - TGeo::NNodes, x) -
                                            linearSideMappings(subSide - TGeo::NNodes, x));
                }
            }
        }
//        }
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "Non-linear mapping: ";
            for (int x = 0; x < 3; x++) soutLogDebug << nonLinearSideMappings(sideIndex, x) << "\t";
            soutLogDebug << "\nGrad of non-linear mapping:\n";
            for(int i = 0; i < gradNonLinSide.Rows(); i++){
                for(int j = 0; j < gradNonLinSide.Cols(); j++){
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<gradNonLinSide(i,j);
                    if(j != gradNonLinSide.Cols() - 1) soutLogDebug<<"\t";
                }
                soutLogDebug<<std::endl;
            }
            soutLogDebug << std::endl;
            soutLogDebug << "adding to result mapping of side: " << side << std::endl;
            soutLogDebug << "\t\tcorrection factor: " << blendFactor[sideIndex] << std::endl;
            soutLogDebug << "\t\tdCorrFactorDxi: ";
            for(int i = 0; i < TGeo::Dimension; i++) soutLogDebug<<dCorrFactorDxi(sideIndex,i)<<"\t";
            soutLogDebug << "\n";

            soutLogDebug<<"SECOND TERM (SIDE "<<sideIndex<<") :"<<std::endl;
            soutLogDebug << "\t\tblendFactor *  (gradNonLinSide-gradLinSide): " << std::endl;
            for (int i = 0; i < 3; i++) {
                for (int j = 0; j < TGeo::Dimension; j++) {
                    const T val = blendFactor[sideIndex] *  (gradNonLinSide(i,j)-gradLinSide(i,j));
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<val;
                    if(j != TGeo::Dimension - 1) soutLogDebug<<"\t";
                }
                soutLogDebug << "\n";
            }
            soutLogDebug<<"THIRD TERM (SIDE "<<sideIndex<<") :"<<std::endl;
            soutLogDebug << "\t\tdCorrFactorDxi *\n"
                            "                              (nonLinearSideMappings -\n"
                            "                               linearSideMappings): " << std::endl;
            for (int i = 0; i < 3; i++) {
                for (int j = 0; j < TGeo::Dimension; j++) {
                    const T val = dCorrFactorDxi(sideIndex,j) *
                                  (nonLinearSideMappings(sideIndex, i) -
                                   linearSideMappings(sideIndex,i));
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<val;
                    if(j != TGeo::Dimension - 1) soutLogDebug<<"\t";
                }
                soutLogDebug << "\n";
            }

            soutLogDebug<<std::endl;
        }
#endif

        for (int i = 0; i < 3; i++) {
            for (int j = 0; j < TGeo::Dimension; j++) {
                gradx(i,j) += blendFactor[sideIndex] *  (gradNonLinSide(i,j)-gradLinSide(i,j));
                gradx(i,j) += dCorrFactorDxi(sideIndex,j) *
                              (nonLinearSideMappings(sideIndex, i) -
                               linearSideMappings(sideIndex,i));
            }
        }
    }
#ifdef PZ_LOG
    if(logger.isDebugEnabled()){
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "=============result=============" <<std::endl;
        soutLogDebug <<"================================"<<std::endl;
        for(int i = 0; i < gradx.Rows(); i++){
            for(int j = 0; j < gradx.Cols(); j++){
                soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<gradx(i,j);
                if(j != gradx.Cols() - 1) soutLogDebug<<"\t";
            }
            soutLogDebug<<std::endl;
        }
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        LOGPZ_DEBUG(logger,soutLogDebug.str())
        soutLogDebug.str("");
    }
#endif
#ifdef PZDEBUG
    for(int i = 0; i < gradx.Rows();i++){
        for(int j = 0; j < gradx.Cols(); j++) {
            if (std::isnan(TPZExtractVal::val(gradx(i,j)))) {
                DebugStop();
            }
        }
    }
#endif

}